

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.h
# Opt level: O0

void revert_scale_extra_bits(SubpelParams *sp)

{
  SubpelParams *sp_local;
  
  sp->subpel_x = sp->subpel_x >> 6;
  sp->subpel_y = sp->subpel_y >> 6;
  sp->xs = sp->xs >> 6;
  sp->ys = sp->ys >> 6;
  return;
}

Assistant:

static inline void revert_scale_extra_bits(SubpelParams *sp) {
  sp->subpel_x >>= SCALE_EXTRA_BITS;
  sp->subpel_y >>= SCALE_EXTRA_BITS;
  sp->xs >>= SCALE_EXTRA_BITS;
  sp->ys >>= SCALE_EXTRA_BITS;
  assert(sp->subpel_x < SUBPEL_SHIFTS);
  assert(sp->subpel_y < SUBPEL_SHIFTS);
  assert(sp->xs <= SUBPEL_SHIFTS);
  assert(sp->ys <= SUBPEL_SHIFTS);
}